

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insertproxymodel.cpp
# Opt level: O1

void __thiscall
InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModelPrivate *this,InsertProxyModel *q)

{
  InsertProxyModel *pIVar1;
  undefined4 *puVar2;
  RolesContainer starHeader;
  key_type local_6c;
  Connection local_68;
  QString local_60;
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  copy;
  
  (this->m_insertDirection).i = 0;
  memset(&this->m_layoutChangePersistentIndexes,0,0x90);
  this->m_extraHeaderData[0].d.d =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)0x0;
  this->m_extraHeaderData[1].d.d =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)0x0;
  (this->m_dataForCorner).d.d =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)0x0;
  this->m_separateEditDisplay = false;
  (this->m_sourceConnections).d.d = (Data *)0x0;
  (this->m_sourceConnections).d.ptr = (Connection *)0x0;
  (this->m_sourceConnections).d.size = 0;
  this->q_ptr = q;
  starHeader.d.d =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
          *)0x0;
  local_6c = 0;
  QString::QString(&local_60,(QChar)0x2a);
  ::QVariant::QVariant((QVariant *)&copy,(QMetaType)0x1694b0,&local_60);
  QMap<int,_QVariant>::detach(&starHeader);
  std::map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>>::
  insert_or_assign<QVariant_const&>
            ((map<int,QVariant,std::less<int>,std::allocator<std::pair<int_const,QVariant>>> *)
             ((long)starHeader.d.d + 8),&local_6c,(QVariant *)&copy);
  ::QVariant::~QVariant((QVariant *)&copy);
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,8);
    }
  }
  if (starHeader.d.d !=
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)starHeader.d.d = *(int *)starHeader.d.d + 1;
    UNLOCK();
  }
  copy.d = this->m_extraHeaderData[1].d.d;
  this->m_extraHeaderData[1].d.d =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)starHeader.d.d;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&copy);
  if (starHeader.d.d !=
      (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
       *)0x0) {
    LOCK();
    *(int *)starHeader.d.d = *(int *)starHeader.d.d + 1;
    UNLOCK();
  }
  copy.d = this->m_extraHeaderData[0].d.d;
  this->m_extraHeaderData[0].d.d =
       (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
        *)starHeader.d.d;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&copy);
  pIVar1 = this->q_ptr;
  copy.d = (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
            *)InsertProxyModel::extraDataChanged;
  puVar2 = (undefined4 *)operator_new(0x18);
  *puVar2 = 1;
  *(code **)(puVar2 + 2) =
       QtPrivate::
       QFunctorSlotObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/src/insertproxymodel.cpp:217:22),_3,_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&,_const_QList<int>_&>,_void>
       ::impl;
  *(InsertProxyModelPrivate **)(puVar2 + 4) = this;
  QObject::connectImpl
            ((QObject *)&local_68,(void **)pIVar1,(QObject *)&copy,(void **)pIVar1,
             (QSlotObjectBase *)0x0,(ConnectionType)puVar2,(int *)0x1,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_68);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&starHeader.d);
  return;
}

Assistant:

InsertProxyModelPrivate::InsertProxyModelPrivate(InsertProxyModel *q)
    : q_ptr(q)
    , m_insertDirection(InsertProxyModel::NoInsert)
    , m_separateEditDisplay(false)
{
    Q_ASSERT(q_ptr);
    RolesContainer starHeader;
    starHeader.insert(Qt::DisplayRole, QVariant::fromValue(QString(QLatin1Char('*'))));
    m_extraHeaderData[true] = starHeader;
    m_extraHeaderData[false] = starHeader;
    QObject::connect(q_ptr, &InsertProxyModel::extraDataChanged,
                     [this](const QModelIndex &topLeft, const QModelIndex &bottomRight, const QVector<int> &roles) -> void {
                         checkExtraDataChanged(topLeft, bottomRight, roles);
                     });
}